

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLoc::dump
          (DWARFDebugLoc *this,raw_ostream *OS,MCRegisterInfo *MRI,DIDumpOptions DumpOpts,
          Optional<unsigned_long> Offset)

{
  bool bVar1;
  unsigned_long *puVar2;
  LocationList *L_00;
  const_iterator pLVar3;
  const_reference pLVar4;
  LocationList *L_1;
  const_iterator __end1;
  const_iterator __begin1;
  LocationLists *__range1;
  LocationList *L;
  anon_class_32_4_b58d201b DumpLocationList;
  MCRegisterInfo *MRI_local;
  raw_ostream *OS_local;
  DWARFDebugLoc *this_local;
  Optional<unsigned_long> Offset_local;
  
  this_local = (DWARFDebugLoc *)Offset.Storage.field_0;
  Offset_local.Storage.field_0.empty = Offset.Storage.hasVal;
  DumpLocationList.MRI = (MCRegisterInfo **)&DumpOpts;
  DumpLocationList.this = (DWARFDebugLoc *)&DumpLocationList.DumpOpts;
  L = (LocationList *)OS;
  DumpLocationList.OS = (raw_ostream *)this;
  DumpLocationList.DumpOpts = (DIDumpOptions *)MRI;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&this_local);
  if (bVar1) {
    puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&this_local);
    L_00 = getLocationListAtOffset(this,*puVar2);
    if (L_00 != (LocationList *)0x0) {
      dump::anon_class_32_4_b58d201b::operator()((anon_class_32_4_b58d201b *)&L,L_00);
    }
  }
  else {
    __end1 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::begin
                       ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void> *)this);
    pLVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::end
                       ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void> *)this);
    for (; __end1 != pLVar3; __end1 = __end1 + 1) {
      dump::anon_class_32_4_b58d201b::operator()((anon_class_32_4_b58d201b *)&L,__end1);
      pLVar4 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::back
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void> *)this
                         );
      if (__end1 != pLVar4) {
        raw_ostream::operator<<(OS,'\n');
      }
    }
  }
  return;
}

Assistant:

void DWARFDebugLoc::dump(raw_ostream &OS, const MCRegisterInfo *MRI, DIDumpOptions DumpOpts,
                         Optional<uint64_t> Offset) const {
  auto DumpLocationList = [&](const LocationList &L) {
    OS << format("0x%8.8" PRIx64 ": ", L.Offset);
    L.dump(OS, 0, IsLittleEndian, AddressSize, MRI, nullptr, DumpOpts, 12);
    OS << "\n";
  };

  if (Offset) {
    if (auto *L = getLocationListAtOffset(*Offset))
      DumpLocationList(*L);
    return;
  }

  for (const LocationList &L : Locations) {
    DumpLocationList(L);
    if (&L != &Locations.back())
      OS << '\n';
  }
}